

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maplayers.cpp
# Opt level: O2

void __thiscall CMapLayers::OnRender(CMapLayers *this)

{
  float CenterX;
  float CenterY;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  CCamera *pCVar9;
  IGraphics *pIVar10;
  IInput *pIVar11;
  IClient *pIVar12;
  IStorage *pIVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  CTextureHandle CVar20;
  CMapItemGroup *pGroup;
  ulong uVar21;
  CMapItemLayerTilemap *pCVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CMapItemLayerTilemap *pCVar23;
  CGameClient *pCVar24;
  int x;
  int iVar25;
  int y;
  uint Index;
  CLayers *this_00;
  bool bVar26;
  CMapItemLayerTilemap *pTMap;
  long in_FS_OFFSET;
  float fVar27;
  float fVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  vec4 Color;
  vec4 Color_00;
  vec4 Color_01;
  CUIRect Screen;
  char aFilename [512];
  float Points [4];
  undefined1 local_21ac [380];
  undefined8 local_2030;
  undefined8 local_1030;
  long local_38;
  IOHANDLE io;
  
  local_1030 = 0;
  local_2030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar24 = (this->super_CComponent).m_pClient;
  if (pCVar24->m_pClient->m_State - 3U < 2) {
    this_00 = &pCVar24->m_Layers;
  }
  else {
    if (this->m_pMenuMap == (IEngineMap *)0x0) goto LAB_00141967;
    iVar17 = (*(this->m_pMenuMap->super_IMap).super_IInterface._vptr_IInterface[10])();
    this_00 = this->m_pMenuLayers;
    if ((this_00 != (CLayers *)0x0 & (byte)iVar17) != 1) goto LAB_00141967;
    pCVar24 = (this->super_CComponent).m_pClient;
  }
  (*(pCVar24->m_pGraphics->super_IInterface)._vptr_IInterface[6])
            (pCVar24->m_pGraphics,&Screen,&Screen.y,&Screen.w,&Screen.h);
  pCVar9 = ((this->super_CComponent).m_pClient)->m_pCamera;
  CenterX = (pCVar9->m_Center).field_0.x;
  CenterY = (pCVar9->m_Center).field_1.y;
  bVar26 = false;
  for (Index = 0; (int)Index < this_00->m_GroupsNum; Index = Index + 1) {
    pGroup = CLayers::GetGroup(this_00,Index);
    pCVar24 = (this->super_CComponent).m_pClient;
    if (((pCVar24->m_pConfig->m_GfxNoclip == 0) && (1 < (pGroup->super_CMapItemGroup_v1).m_Version))
       && (pGroup->m_UseClipping != 0)) {
      CRenderTools::MapScreenToGroup
                (&pCVar24->m_RenderTools,CenterX,CenterY,this_00->m_pGameGroup,
                 pCVar24->m_pCamera->m_Zoom);
      pIVar10 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      iVar17 = (*(pIVar10->super_IInterface)._vptr_IInterface[6])
                         (pIVar10,Points,Points + 1,Points + 2,Points + 3);
      uVar1 = pGroup->m_ClipX;
      uVar5 = pGroup->m_ClipY;
      uVar2 = pGroup->m_ClipW;
      uVar6 = pGroup->m_ClipH;
      fVar27 = (float)Points._0_8_;
      fVar36 = (float)Points._8_8_ - fVar27;
      fVar30 = SUB84(Points._0_8_,4);
      fVar37 = SUB84(Points._8_8_,4) - fVar30;
      auVar35._0_4_ = (float)(int)uVar1 - fVar27;
      auVar35._4_4_ = (float)(int)uVar5 - fVar30;
      auVar35._8_4_ = (float)(int)(uVar2 + uVar1) - fVar27;
      auVar35._12_4_ = (float)(int)(uVar6 + uVar5) - fVar30;
      auVar28._4_4_ = fVar37;
      auVar28._0_4_ = fVar36;
      auVar28._8_4_ = fVar36;
      auVar28._12_4_ = fVar37;
      auVar28 = divps(auVar35,auVar28);
      fVar27 = auVar28._0_4_;
      fVar30 = auVar28._4_4_;
      fVar36 = auVar28._8_4_;
      fVar37 = auVar28._12_4_;
      auVar33._4_4_ = -(uint)(fVar30 <= 1.0);
      auVar33._0_4_ = -(uint)(fVar27 <= 1.0);
      auVar14._4_4_ = Points[0];
      auVar14._8_4_ = Points[1];
      auVar14._0_4_ = fVar30;
      auVar31._0_8_ = auVar14._0_8_ << 0x20;
      auVar31._8_4_ = fVar36;
      auVar31._12_4_ = fVar37;
      auVar15._4_8_ = auVar31._8_8_;
      auVar15._0_4_ = -(uint)(1.0 <= fVar30);
      auVar32._0_8_ = auVar15._0_8_ << 0x20;
      auVar32._8_4_ = -(uint)(0.0 <= fVar36);
      auVar32._12_4_ = -(uint)(0.0 <= fVar37);
      auVar33._8_8_ = auVar32._8_8_;
      iVar17 = movmskps(iVar17,auVar33);
      if (iVar17 == 0xf) {
        pIVar10 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        (*(pIVar10->super_IInterface)._vptr_IInterface[3])
                  (pIVar10,(ulong)(uint)(int)(fVar27 * (float)pIVar10->m_ScreenWidth),
                   (ulong)(uint)(int)(fVar30 * (float)pIVar10->m_ScreenHeight),
                   (ulong)(uint)(int)((fVar36 - fVar27) * (float)pIVar10->m_ScreenWidth),
                   (ulong)(uint)(int)((fVar37 - fVar30) * (float)pIVar10->m_ScreenHeight));
        pCVar24 = (this->super_CComponent).m_pClient;
        goto LAB_00141400;
      }
    }
    else {
LAB_00141400:
      CRenderTools::MapScreenToGroup
                (&pCVar24->m_RenderTools,CenterX,CenterY,pGroup,pCVar24->m_pCamera->m_Zoom);
      uVar21 = 0;
      while (iVar17 = (int)uVar21, iVar17 < (pGroup->super_CMapItemGroup_v1).m_NumLayers) {
        pCVar22 = (CMapItemLayerTilemap *)
                  CLayers::GetLayer(this_00,(pGroup->super_CMapItemGroup_v1).m_StartLayer + iVar17);
        pCVar23 = this_00->m_pGameLayer;
        if (pCVar22 == pCVar23) {
          bVar26 = true;
        }
        if (this->m_Type == -1) {
LAB_0014149c:
          if (((((pCVar22->m_Layer).m_Flags & 1) == 0) || (pCVar22 == pCVar23)) ||
             ((pCVar24 = (this->super_CComponent).m_pClient,
              pCVar24->m_pConfig->m_GfxHighDetail != 0 || (1 < pCVar24->m_pClient->m_State - 3U))))
          {
            if (((((pCVar22->m_Layer).m_Type == 2) &&
                 (pIVar11 = ((this->super_CComponent).m_pClient)->m_pInput,
                 iVar18 = (*(pIVar11->super_IInterface)._vptr_IInterface[4])(pIVar11,0x160),
                 (char)iVar18 != '\0')) &&
                (pIVar11 = ((this->super_CComponent).m_pClient)->m_pInput,
                iVar18 = (*(pIVar11->super_IInterface)._vptr_IInterface[4])(pIVar11,0x161),
                (char)iVar18 != '\0')) &&
               (bVar16 = CUI::KeyPress(&((this->super_CComponent).m_pClient)->m_UI,0xe2), bVar16)) {
              iVar18 = (*(this_00->m_pMap->super_IInterface)._vptr_IInterface[2])
                                 (this_00->m_pMap,(ulong)(uint)pCVar22->m_Data);
              pIVar12 = ((this->super_CComponent).m_pClient)->m_pClient;
              (*(pIVar12->super_IInterface)._vptr_IInterface[0x1d])(pIVar12,Points);
              str_format(aFilename,0x200,"dumps/tilelayer_dump_%s-%d-%d-%dx%d.txt",local_21ac,
                         (ulong)Index,uVar21,(ulong)(uint)pCVar22->m_Width,
                         (ulong)(uint)pCVar22->m_Height);
              pIVar13 = ((this->super_CComponent).m_pClient)->m_pStorage;
              iVar19 = (*(pIVar13->super_IInterface)._vptr_IInterface[4])
                                 (pIVar13,aFilename,2,0,0,0,0,0);
              io = (IOHANDLE)CONCAT44(extraout_var_00,iVar19);
              if (io != (IOHANDLE)0x0) {
                for (iVar19 = 0; iVar19 < pCVar22->m_Height; iVar19 = iVar19 + 1) {
                  for (iVar25 = 0; iVar25 < pCVar22->m_Width; iVar25 = iVar25 + 1) {
                    io_write(io,(void *)(CONCAT44(extraout_var,iVar18) +
                                        (long)(pCVar22->m_Width * iVar19 + iVar25) * 4),1);
                  }
                  io_write_newline(io);
                }
                io_close(io);
              }
            }
            if (pCVar22 != pCVar23) {
              iVar18 = (pCVar22->m_Layer).m_Type;
              if (iVar18 == 3) {
                pCVar24 = (this->super_CComponent).m_pClient;
                pIVar10 = pCVar24->m_pGraphics;
                CVar20.m_Id = 0xffffffff;
                if (pCVar22->m_Flags != -1) {
                  CVar20 = CMapImages::Get(pCVar24->m_pMapimages,pCVar22->m_Flags);
                }
                (*(pIVar10->super_IInterface)._vptr_IInterface[0x13])
                          (pIVar10,(ulong)(uint)CVar20.m_Id);
                iVar18 = (*(this_00->m_pMap->super_IInterface)._vptr_IInterface[3])
                                   (this_00->m_pMap,(ulong)(uint)pCVar22->m_Height);
                (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface).
                  _vptr_IInterface[8])();
                CRenderTools::RenderQuads
                          (&((this->super_CComponent).m_pClient)->m_RenderTools,
                           (CQuad *)CONCAT44(extraout_var_02,iVar18),pCVar22->m_Width,2,EnvelopeEval
                           ,this);
              }
              else if (iVar18 == 2) {
                pCVar24 = (this->super_CComponent).m_pClient;
                pIVar10 = pCVar24->m_pGraphics;
                CVar20.m_Id = 0xffffffff;
                if (pCVar22->m_Image != -1) {
                  CVar20 = CMapImages::Get(pCVar24->m_pMapimages,pCVar22->m_Image);
                }
                (*(pIVar10->super_IInterface)._vptr_IInterface[0x13])
                          (pIVar10,(ulong)(uint)CVar20.m_Id);
                iVar18 = (*(this_00->m_pMap->super_IInterface)._vptr_IInterface[2])
                                   (this_00->m_pMap,(ulong)(uint)pCVar22->m_Data);
                (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface).
                  _vptr_IInterface[7])();
                uVar3 = (pCVar22->m_Color).r;
                uVar7 = (pCVar22->m_Color).g;
                auVar34._0_4_ = (float)(int)uVar3;
                auVar34._4_4_ = (float)(int)uVar7;
                auVar34._8_8_ = 0;
                auVar35 = divps(auVar34,_DAT_001c9f70);
                uVar4 = (pCVar22->m_Color).b;
                uVar8 = (pCVar22->m_Color).a;
                auVar29._0_4_ = (float)(int)uVar4;
                auVar29._4_4_ = (float)(int)uVar8;
                auVar29._8_8_ = 0;
                auVar28 = divps(auVar29,_DAT_001c9f70);
                Color._0_8_ = auVar35._0_8_;
                Color._8_8_ = auVar28._0_8_;
                CRenderTools::RenderTilemap
                          (&((this->super_CComponent).m_pClient)->m_RenderTools,
                           (CTile *)CONCAT44(extraout_var_01,iVar18),pCVar22->m_Width,
                           pCVar22->m_Height,32.0,Color,5,EnvelopeEval,this,pCVar22->m_ColorEnv,
                           pCVar22->m_ColorEnvOffset);
                (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface).
                  _vptr_IInterface[8])();
                Color_00.field_2 =
                     (anon_union_4_2_94730039_for_vector4_base<float>_5)(int)Color._8_8_;
                Color_00.field_3 =
                     (anon_union_4_2_94730017_for_vector4_base<float>_7)
                     (int)((ulong)Color._8_8_ >> 0x20);
                Color_00.field_0 =
                     (anon_union_4_2_94730227_for_vector4_base<float>_1)(int)Color._0_8_;
                Color_00.field_1 =
                     (anon_union_4_2_947300d3_for_vector4_base<float>_3)
                     (int)((ulong)Color._0_8_ >> 0x20);
                CRenderTools::RenderTilemap
                          (&((this->super_CComponent).m_pClient)->m_RenderTools,
                           (CTile *)CONCAT44(extraout_var_01,iVar18),pCVar22->m_Width,
                           pCVar22->m_Height,32.0,Color_00,6,EnvelopeEval,this,pCVar22->m_ColorEnv,
                           pCVar22->m_ColorEnvOffset);
              }
            }
          }
          bVar16 = CGameClient::IsEaster((this->super_CComponent).m_pClient);
          if (bVar16) {
            pCVar23 = (CMapItemLayerTilemap *)
                      CLayers::GetLayer(this_00,(pGroup->super_CMapItemGroup_v1).m_StartLayer +
                                                iVar17 + 1);
            if (((this->m_pEggTiles != (CTile *)0x0) &&
                (iVar17 + 1 < (pGroup->super_CMapItemGroup_v1).m_NumLayers)) &&
               (pCVar23 == this_00->m_pGameLayer)) {
              pCVar24 = (this->super_CComponent).m_pClient;
              pIVar10 = pCVar24->m_pGraphics;
              CVar20 = CMapImages::GetEasterTexture(pCVar24->m_pMapimages);
              (*(pIVar10->super_IInterface)._vptr_IInterface[0x13])
                        (pIVar10,(ulong)(uint)CVar20.m_Id);
              (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface).
                _vptr_IInterface[8])();
              Color_01._0_8_ = DAT_001c8b60;
              Color_01.field_2 =
                   (anon_union_4_2_94730039_for_vector4_base<float>_5)(int)Color_01._0_8_;
              Color_01.field_3 =
                   (anon_union_4_2_94730017_for_vector4_base<float>_7)
                   (int)((ulong)Color_01._0_8_ >> 0x20);
              CRenderTools::RenderTilemap
                        (&((this->super_CComponent).m_pClient)->m_RenderTools,this->m_pEggTiles,
                         this->m_EggLayerWidth,this->m_EggLayerHeight,32.0,Color_01,2,EnvelopeEval,
                         this,-1,0);
            }
          }
        }
        else {
          if (this->m_Type == 0) {
            if ((!bVar26) || (1 < ((this->super_CComponent).m_pClient)->m_pClient->m_State - 3U))
            goto LAB_0014149c;
            goto LAB_00141967;
          }
          if ((pCVar22 == pCVar23) != bVar26) goto LAB_0014149c;
        }
        uVar21 = (ulong)(iVar17 + 1);
      }
      pCVar24 = (this->super_CComponent).m_pClient;
      if (pCVar24->m_pConfig->m_GfxNoclip == 0) {
        (*(pCVar24->m_pGraphics->super_IInterface)._vptr_IInterface[4])();
      }
    }
  }
  pCVar24 = (this->super_CComponent).m_pClient;
  if (pCVar24->m_pConfig->m_GfxNoclip == 0) {
    (*(pCVar24->m_pGraphics->super_IInterface)._vptr_IInterface[4])();
    pCVar24 = (this->super_CComponent).m_pClient;
  }
  (*(pCVar24->m_pGraphics->super_IInterface)._vptr_IInterface[5])();
LAB_00141967:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapLayers::OnRender()
{
	CLayers *pLayers = 0;
	if(Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)
		pLayers = Layers();
	else if(m_pMenuMap && m_pMenuMap->IsLoaded())
		pLayers = m_pMenuLayers;

	if(!pLayers)
		return;

	CUIRect Screen;
	Graphics()->GetScreen(&Screen.x, &Screen.y, &Screen.w, &Screen.h);

	vec2 Center = *m_pClient->m_pCamera->GetCenter();

	bool PassedGameLayer = false;

	for(int g = 0; g < pLayers->NumGroups(); g++)
	{
		CMapItemGroup *pGroup = pLayers->GetGroup(g);

		if(!Config()->m_GfxNoclip && pGroup->m_Version >= 2 && pGroup->m_UseClipping)
		{
			// set clipping
			float Points[4];
			RenderTools()->MapScreenToGroup(Center.x, Center.y, pLayers->GameGroup(), m_pClient->m_pCamera->GetZoom());
			Graphics()->GetScreen(&Points[0], &Points[1], &Points[2], &Points[3]);
			float x0 = (pGroup->m_ClipX - Points[0]) / (Points[2]-Points[0]);
			float y0 = (pGroup->m_ClipY - Points[1]) / (Points[3]-Points[1]);
			float x1 = ((pGroup->m_ClipX+pGroup->m_ClipW) - Points[0]) / (Points[2]-Points[0]);
			float y1 = ((pGroup->m_ClipY+pGroup->m_ClipH) - Points[1]) / (Points[3]-Points[1]);

			if(x1 < 0.0f || x0 > 1.0f || y1 < 0.0f || y0 > 1.0f)
				continue;

			Graphics()->ClipEnable((int)(x0*Graphics()->ScreenWidth()), (int)(y0*Graphics()->ScreenHeight()),
				(int)((x1-x0)*Graphics()->ScreenWidth()), (int)((y1-y0)*Graphics()->ScreenHeight()));
		}

		RenderTools()->MapScreenToGroup(Center.x, Center.y, pGroup, m_pClient->m_pCamera->GetZoom());

		for(int l = 0; l < pGroup->m_NumLayers; l++)
		{
			CMapItemLayer *pLayer = pLayers->GetLayer(pGroup->m_StartLayer+l);
			bool Render = false;
			bool IsGameLayer = false;

			if(pLayer == (CMapItemLayer*)pLayers->GameLayer())
			{
				IsGameLayer = true;
				PassedGameLayer = true;
			}

			if(m_Type == -1)
				Render = true;
			else if(m_Type == 0)
			{
				if(PassedGameLayer && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK))
					return;
				Render = true;
			}
			else
			{
				if(PassedGameLayer && !IsGameLayer)
					Render = true;
			}

			if(!Render)
				continue;

			// skip rendering if detail layers is not wanted
			if(!(pLayer->m_Flags&LAYERFLAG_DETAIL && !Config()->m_GfxHighDetail && !IsGameLayer && (Client()->State() == IClient::STATE_ONLINE || Client()->State() == IClient::STATE_DEMOPLAYBACK)))
			{
				if(pLayer->m_Type == LAYERTYPE_TILES && Input()->KeyIsPressed(KEY_LCTRL) && Input()->KeyIsPressed(KEY_LSHIFT) && UI()->KeyPress(KEY_KP_0))
				{
					CMapItemLayerTilemap *pTMap = (CMapItemLayerTilemap *)pLayer;
					CTile *pTiles = (CTile *)pLayers->Map()->GetData(pTMap->m_Data);
					CServerInfo CurrentServerInfo;
					Client()->GetServerInfo(&CurrentServerInfo);
					char aFilename[IO_MAX_PATH_LENGTH];
					str_format(aFilename, sizeof(aFilename), "dumps/tilelayer_dump_%s-%d-%d-%dx%d.txt", CurrentServerInfo.m_aMap, g, l, pTMap->m_Width, pTMap->m_Height);
					IOHANDLE File = Storage()->OpenFile(aFilename, IOFLAG_WRITE, IStorage::TYPE_SAVE);
					if(File)
					{
						for(int y = 0; y < pTMap->m_Height; y++)
						{
							for(int x = 0; x < pTMap->m_Width; x++)
								io_write(File, &(pTiles[y*pTMap->m_Width + x].m_Index), sizeof(pTiles[y*pTMap->m_Width + x].m_Index));
							io_write_newline(File);
						}
						io_close(File);
					}
				}

				if(!IsGameLayer)
				{
					if(pLayer->m_Type == LAYERTYPE_TILES)
					{
						CMapItemLayerTilemap *pTMap = (CMapItemLayerTilemap *)pLayer;
						if(pTMap->m_Image == -1)
							Graphics()->TextureClear();
						else
							Graphics()->TextureSet(m_pClient->m_pMapimages->Get(pTMap->m_Image));

						CTile *pTiles = (CTile *)pLayers->Map()->GetData(pTMap->m_Data);
						Graphics()->BlendNone();
						vec4 Color = vec4(pTMap->m_Color.r/255.0f, pTMap->m_Color.g/255.0f, pTMap->m_Color.b/255.0f, pTMap->m_Color.a/255.0f);
						RenderTools()->RenderTilemap(pTiles, pTMap->m_Width, pTMap->m_Height, 32.0f, Color, TILERENDERFLAG_EXTEND|LAYERRENDERFLAG_OPAQUE,
														EnvelopeEval, this, pTMap->m_ColorEnv, pTMap->m_ColorEnvOffset);
						Graphics()->BlendNormal();
						RenderTools()->RenderTilemap(pTiles, pTMap->m_Width, pTMap->m_Height, 32.0f, Color, TILERENDERFLAG_EXTEND|LAYERRENDERFLAG_TRANSPARENT,
														EnvelopeEval, this, pTMap->m_ColorEnv, pTMap->m_ColorEnvOffset);
					}
					else if(pLayer->m_Type == LAYERTYPE_QUADS)
					{
						CMapItemLayerQuads *pQLayer = (CMapItemLayerQuads *)pLayer;
						if(pQLayer->m_Image == -1)
							Graphics()->TextureClear();
						else
							Graphics()->TextureSet(m_pClient->m_pMapimages->Get(pQLayer->m_Image));

						CQuad *pQuads = (CQuad *)pLayers->Map()->GetDataSwapped(pQLayer->m_Data);

						//Graphics()->BlendNone();
						//RenderTools()->RenderQuads(pQuads, pQLayer->m_NumQuads, LAYERRENDERFLAG_OPAQUE, EnvelopeEval, this);
						Graphics()->BlendNormal();
						RenderTools()->RenderQuads(pQuads, pQLayer->m_NumQuads, LAYERRENDERFLAG_TRANSPARENT, EnvelopeEval, this);
					}
				}
			}

			// eggs
			if(m_pClient->IsEaster())
			{
				CMapItemLayer *pNextLayer = pLayers->GetLayer(pGroup->m_StartLayer+l+1);
				if(m_pEggTiles && (l+1) < pGroup->m_NumLayers && pNextLayer == (CMapItemLayer*)pLayers->GameLayer())
				{
					Graphics()->TextureSet(m_pClient->m_pMapimages->GetEasterTexture());
					Graphics()->BlendNormal();
					RenderTools()->RenderTilemap(m_pEggTiles, m_EggLayerWidth, m_EggLayerHeight, 32.0f, vec4(1,1,1,1), LAYERRENDERFLAG_TRANSPARENT, EnvelopeEval, this, -1, 0);
				}
			}
		}
		if(!Config()->m_GfxNoclip)
			Graphics()->ClipDisable();
	}

	if(!Config()->m_GfxNoclip)
		Graphics()->ClipDisable();

	// reset the screen like it was before
	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);
}